

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

void __thiscall
nonsugar::detail::parse_argument<std::__cxx11::string,int,void>::operator()
          (parse_argument<std::__cxx11::string,int,void> *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              last,shared_ptr<int> *value,
          argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_std::vector<int,_std::allocator<int>_>_>
          *arg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  char *s;
  shared_ptr<int> sVar1;
  shared_ptr<int> v;
  undefined1 local_d8 [16];
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (it->_M_current == last._M_current) {
    widen<std::__cxx11::string>(&local_c8,(detail *)"argument required: ",(char *)it->_M_current);
    std::operator+(&local_48,&local_c8,&arg->placeholder);
    std::__cxx11::string::operator=((string *)err,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    sVar1 = std::
            function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arg->read);
    if ((void *)local_d8._0_8_ == (void *)0x0) {
      widen<std::__cxx11::string>
                (&local_88,(detail *)"invalid argument: ",
                 (char *)sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                         ._M_pi);
      std::operator+(&local_68,&local_88,&arg->placeholder);
      widen<std::__cxx11::string>(&local_a8,(detail *)"=",s);
      std::operator+(&local_c8,&local_68,&local_a8);
      std::operator+(&local_48,&local_c8,it->_M_current);
      std::__cxx11::string::operator=((string *)err,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      it->_M_current = it->_M_current + 1;
      std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  }
  return;
}

Assistant:

void operator()(
        Iterator &it, Iterator last, std::shared_ptr<Value> &value, Argument const &arg,
        String &err) const
    {
        if (it == last) {
            err = widen<String>("argument required: ") + arg.placeholder;
            return;
        }
        auto const v = arg.read(*it);
        if (!v) {
            err = widen<String>("invalid argument: ") + arg.placeholder + widen<String>("=") + *it;
            return;
        }
        ++it;
        value = v;
    }